

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_sbc_zero_x_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_sbc_zero_x_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_sbc_zero_x_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x118);
  anon_unknown.dwarf_217e71::CpuZeropageIndexedTest_sbc_zero_x_Test::
  CpuZeropageIndexedTest_sbc_zero_x_Test((CpuZeropageIndexedTest_sbc_zero_x_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }